

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O2

void draw_corners(Am_Drawonable *d,int rect_left,int rect_top,int rect_width,int rect_height)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = rect_width + rect_left;
  iVar3 = rect_width + -3 + rect_left;
  iVar2 = rect_height + rect_top;
  iVar4 = rect_height + rect_top + -3;
  (**(code **)(*(long *)d + 0x130))(d,&black,&red,rect_left + -3,rect_top + -3,6,6,0,0x168,0,1);
  (**(code **)(*(long *)d + 0x130))(d,&black,&red,rect_left + -3,iVar4,6,6,0,0x168,0,1);
  (**(code **)(*(long *)d + 0x130))(d,&black,&red,iVar3,rect_top + -3,6,6,0,0x168,0,1);
  (**(code **)(*(long *)d + 0x130))(d,&black,&red,iVar3,iVar4,6,6,0,0x168,0,1);
  (**(code **)(*(long *)d + 0x140))(d,&red,rect_left,rect_top,iVar1,rect_top,0);
  (**(code **)(*(long *)d + 0x140))(d,&red,rect_left,rect_top,rect_left,iVar2,0);
  (**(code **)(*(long *)d + 0x140))(d,&red,rect_left,iVar2,iVar1,iVar2,0);
  (**(code **)(*(long *)d + 0x140))(d,&red,iVar1,rect_top,iVar1,iVar2,0);
  return;
}

Assistant:

void
draw_corners(Am_Drawonable *d, int rect_left, int rect_top, int rect_width,
             int rect_height)
{
  int angle1 = 0;
  int angle2 = 360;
  int arc_width = 6;
  int half_width = arc_width / 2;
  int x1 = rect_left - half_width;
  int y1 = rect_top - half_width;
  int x2 = (rect_left + rect_width) - half_width;
  int y2 = (rect_top + rect_height) - half_width;

  d->Draw_Arc(black, red, x1, y1, arc_width, arc_width, angle1, angle2);
  d->Draw_Arc(black, red, x1, y2, arc_width, arc_width, angle1, angle2);
  d->Draw_Arc(black, red, x2, y1, arc_width, arc_width, angle1, angle2);
  d->Draw_Arc(black, red, x2, y2, arc_width, arc_width, angle1, angle2);

  int xx1 = x1 + half_width;
  int xx2 = x2 + half_width;
  int yy1 = y1 + half_width;
  int yy2 = y2 + half_width;
  d->Draw_Line(red, xx1, yy1, xx2, yy1);
  d->Draw_Line(red, xx1, yy1, xx1, yy2);
  d->Draw_Line(red, xx1, yy2, xx2, yy2);
  d->Draw_Line(red, xx2, yy1, xx2, yy2);
}